

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_tuple.hpp
# Opt level: O0

void __thiscall
burst::dynamic_tuple::accomodate<std::vector<unsigned_long,std::allocator<unsigned_long>>>
          (dynamic_tuple *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *object,
          int8_t *creation_place)

{
  size_t sVar1;
  int8_t *piVar2;
  object_info_t local_38;
  size_t local_28;
  size_t new_offset;
  int8_t *creation_place_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *object_local;
  dynamic_tuple *this_local;
  
  new_offset = (size_t)creation_place;
  creation_place_local = (int8_t *)object;
  object_local = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)this;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)creation_place,object);
  sVar1 = new_offset;
  piVar2 = data(this);
  local_28 = sVar1 - (long)piVar2;
  local_38 = management::make_object_info<std::vector<unsigned_long,std::allocator<unsigned_long>>>
                       (local_28);
  std::vector<burst::management::object_info_t,_std::allocator<burst::management::object_info_t>_>::
  push_back(&this->m_objects,&local_38);
  this->m_volume = local_28 + 0x18;
  return;
}

Assistant:

void accomodate (T && object, std::int8_t * creation_place)
        {
            using raw_type = std::decay_t<T>;
            new (creation_place) raw_type(std::forward<T>(object));

            const auto new_offset = static_cast<std::size_t>(creation_place - data());
            m_objects.push_back(management::make_object_info<raw_type>(new_offset));
            m_volume = new_offset + sizeof(raw_type);
        }